

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlCheckFilename(char *path)

{
  int iVar1;
  int iVar2;
  stat stat_buffer;
  stat64 sStack_98;
  
  iVar2 = 0;
  if (path != (char *)0x0) {
    iVar1 = stat64(path,&sStack_98);
    iVar2 = 0;
    if (iVar1 != -1) {
      iVar2 = ((sStack_98.st_mode & 0xf000) == 0x4000) + 1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlCheckFilename (const char *path)
{
#ifdef HAVE_STAT
#if defined(_WIN32)
    struct _stat stat_buffer;
#else
    struct stat stat_buffer;
#endif
#endif
    if (path == NULL)
	return(0);

#ifdef HAVE_STAT
#if defined(_WIN32)
    /*
     * On Windows stat and wstat do not work with long pathname,
     * which start with '\\?\'
     */
    if ((path[0] == '\\') && (path[1] == '\\') && (path[2] == '?') &&
	(path[3] == '\\') )
	    return 1;

    if (xmlWrapStatUtf8(path, &stat_buffer) == -1)
        return 0;
#else
    if (stat(path, &stat_buffer) == -1)
        return 0;
#endif
#ifdef S_ISDIR
    if (S_ISDIR(stat_buffer.st_mode))
        return 2;
#endif
#endif /* HAVE_STAT */
    return 1;
}